

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

int ftp_domore_getsock(Curl_easy *data,connectdata *conn,curl_socket_t *socks)

{
  bool bVar1;
  int local_40;
  int local_3c;
  int i;
  int s;
  _Bool any;
  int bits;
  ftp_conn *ftpc;
  curl_socket_t *socks_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if (((conn->cnnct).state == CONNECT_INIT) || (CONNECT_REQ_READ_MORE < (conn->cnnct).state)) {
    if ((conn->proto).ftpc.state == FTP_STOP) {
      s = 1;
      bVar1 = false;
      *socks = conn->sock[0];
      if ((*(ulong *)&(data->set).field_0x9a0 >> 0xe & 1) == 0) {
        local_3c = 1;
        for (local_40 = 0; local_40 < 2; local_40 = local_40 + 1) {
          if (conn->tempsock[local_40] != -1) {
            socks[local_3c] = conn->tempsock[local_40];
            s = 1 << ((char)local_3c + 0x10U & 0x1f) | s;
            bVar1 = true;
            local_3c = local_3c + 1;
          }
        }
      }
      if (!bVar1) {
        socks[1] = conn->sock[1];
        s = s | 0x20002;
      }
      data_local._4_4_ = s;
    }
    else {
      data_local._4_4_ = Curl_pp_getsock(data,&(conn->proto).ftpc.pp,socks);
    }
  }
  else {
    data_local._4_4_ = Curl_SOCKS_getsock(conn,socks,1);
  }
  return data_local._4_4_;
}

Assistant:

static int ftp_domore_getsock(struct Curl_easy *data,
                              struct connectdata *conn, curl_socket_t *socks)
{
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  (void)data;

  /* When in DO_MORE state, we could be either waiting for us to connect to a
   * remote site, or we could wait for that site to connect to us. Or just
   * handle ordinary commands.
   */

  if(SOCKS_STATE(conn->cnnct.state))
    return Curl_SOCKS_getsock(conn, socks, SECONDARYSOCKET);

  if(FTP_STOP == ftpc->state) {
    int bits = GETSOCK_READSOCK(0);
    bool any = FALSE;

    /* if stopped and still in this state, then we're also waiting for a
       connect on the secondary connection */
    socks[0] = conn->sock[FIRSTSOCKET];

    if(!data->set.ftp_use_port) {
      int s;
      int i;
      /* PORT is used to tell the server to connect to us, and during that we
         don't do happy eyeballs, but we do if we connect to the server */
      for(s = 1, i = 0; i<2; i++) {
        if(conn->tempsock[i] != CURL_SOCKET_BAD) {
          socks[s] = conn->tempsock[i];
          bits |= GETSOCK_WRITESOCK(s++);
          any = TRUE;
        }
      }
    }
    if(!any) {
      socks[1] = conn->sock[SECONDARYSOCKET];
      bits |= GETSOCK_WRITESOCK(1) | GETSOCK_READSOCK(1);
    }

    return bits;
  }
  return Curl_pp_getsock(data, &conn->proto.ftpc.pp, socks);
}